

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

void rsa_ssh1_public_blob(BinarySink *bs,RSAKey *key,RsaSsh1Order order)

{
  BinarySink *bs_00;
  size_t val;
  mp_int **ppmVar1;
  
  bs_00 = bs->binarysink_;
  val = mp_get_nbits(key->modulus);
  BinarySink_put_uint32(bs_00,val);
  if (order == RSA_SSH1_EXPONENT_FIRST) {
    ppmVar1 = &key->modulus;
    BinarySink_put_mp_ssh1(bs->binarysink_,key->exponent);
  }
  else {
    BinarySink_put_mp_ssh1(bs->binarysink_,key->modulus);
    ppmVar1 = &key->exponent;
  }
  BinarySink_put_mp_ssh1(bs->binarysink_,*ppmVar1);
  return;
}

Assistant:

void rsa_ssh1_public_blob(BinarySink *bs, RSAKey *key,
                          RsaSsh1Order order)
{
    put_uint32(bs, mp_get_nbits(key->modulus));
    if (order == RSA_SSH1_EXPONENT_FIRST) {
        put_mp_ssh1(bs, key->exponent);
        put_mp_ssh1(bs, key->modulus);
    } else {
        put_mp_ssh1(bs, key->modulus);
        put_mp_ssh1(bs, key->exponent);
    }
}